

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# admin.cpp
# Opt level: O1

void Commands::Duty(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  pointer pcVar1;
  byte bVar2;
  World *pWVar3;
  size_type sVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  Character *pCVar7;
  size_t __n;
  string *psVar8;
  Character *this;
  Player *pPVar9;
  bool bVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  mapped_type *pmVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Map *pMVar16;
  uchar byte;
  pointer ppCVar17;
  Config *this_00;
  _List_node_base *p_Var18;
  _Hash_node_base *p_Var19;
  long lVar20;
  bool bVar21;
  PacketBuilder reply;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  ac;
  string guild_rank;
  string guild_str;
  undefined1 local_1f0 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  local_1c0;
  Character *local_160;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_158;
  Player *local_150;
  string *local_148;
  World *local_140;
  string local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  key_type local_110;
  key_type local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pWVar3 = from->world;
  local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"UseDutyAdmin","");
  local_158 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&pWVar3->config;
  pmVar15 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[](local_158,&local_1c0.first);
  bVar10 = util::variant::GetBool(pmVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
    operator_delete(local_1c0.first._M_dataplus._M_p,
                    local_1c0.first.field_2._M_allocated_capacity + 1);
  }
  if (bVar10) {
    local_150 = from->player;
    sVar4 = (local_150->dutylast)._M_string_length;
    ppCVar5 = (local_150->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppCVar6 = (local_150->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_140 = pWVar3;
    local_118 = arguments;
    if (ppCVar5 == ppCVar6) {
      local_160 = (Character *)0x0;
    }
    else {
      psVar8 = &local_150->dutylast;
      local_148 = &from->real_name;
      local_160 = (Character *)0x0;
      do {
        ppCVar17 = ppCVar5 + 1;
        pCVar7 = *ppCVar5;
        if (sVar4 == 0) {
          if ((pCVar7 != from) && (pCVar7->admin != ADMIN_PLAYER)) goto LAB_0011f978;
LAB_0011f998:
          bVar10 = false;
        }
        else {
          __n = (pCVar7->real_name)._M_string_length;
          if ((__n != (local_150->dutylast)._M_string_length) ||
             ((__n != 0 &&
              (iVar11 = bcmp((pCVar7->real_name)._M_dataplus._M_p,(psVar8->_M_dataplus)._M_p,__n),
              iVar11 != 0)))) goto LAB_0011f998;
LAB_0011f978:
          if ((local_150->dutylast)._M_string_length == 0) {
            std::__cxx11::string::_M_assign((string *)psVar8);
          }
          else {
            (local_150->dutylast)._M_string_length = 0;
            *(local_150->dutylast)._M_dataplus._M_p = '\0';
          }
          bVar10 = true;
          local_160 = pCVar7;
        }
      } while ((!bVar10) && (ppCVar5 = ppCVar17, ppCVar17 != ppCVar6));
    }
    pCVar7 = local_160;
    if (local_160 != (Character *)0x0) {
      Character::Logout(from);
      pWVar3 = local_140;
      local_150->character = pCVar7;
      if (sVar4 == 0) {
        psVar8 = (local_118->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((local_118->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish == psVar8) {
          bVar10 = false;
          bVar21 = false;
        }
        else {
          util::lowercase(&local_50,psVar8);
          iVar11 = std::__cxx11::string::compare((char *)&local_50);
          bVar21 = iVar11 == 0;
          bVar10 = true;
        }
      }
      else {
        bVar10 = false;
        bVar21 = false;
      }
      if ((bVar10) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (bVar21) {
        local_160->mapid = from->mapid;
        local_160->x = from->x;
        local_160->y = from->y;
        local_160->direction = from->direction;
        local_160->sitting = from->sitting;
      }
      (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_1c0,from);
      pCVar7 = local_160;
      std::__cxx11::string::operator=((string *)&local_160->faux_name,(string *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
        operator_delete(local_1c0.first._M_dataplus._M_p,
                        local_1c0.first.field_2._M_allocated_capacity + 1);
      }
      World::Login(pWVar3,pCVar7);
      Character::CalculateStats(pCVar7,true);
      Character::GuildNameString_abi_cxx11_(&local_b0,pCVar7);
      Character::GuildRankString_abi_cxx11_(&local_d0,pCVar7);
      (*(pCVar7->super_Command_Source)._vptr_Command_Source[2])(&local_1c0,pCVar7);
      PacketBuilder::PacketBuilder
                ((PacketBuilder *)local_1f0,PACKET_WELCOME,PACKET_REPLY,
                 local_1c0.first._M_string_length +
                 local_d0._M_string_length +
                 local_b0._M_string_length + (pCVar7->title)._M_string_length + 0x90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
        operator_delete(local_1c0.first._M_dataplus._M_p,
                        local_1c0.first.field_2._M_allocated_capacity + 1);
      }
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,1);
      iVar11 = Character::PlayerID(pCVar7);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,iVar11);
      PacketBuilder::AddInt((PacketBuilder *)local_1f0,pCVar7->id);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,(int)pCVar7->mapid);
      local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"GlobalPK","");
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_158,&local_1c0.first);
      bVar10 = util::variant::GetBool(pmVar15);
      if (bVar10) {
        bVar10 = World::PKExcept(pWVar3,(int)pCVar7->mapid);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
          operator_delete(local_1c0.first._M_dataplus._M_p,
                          local_1c0.first.field_2._M_allocated_capacity + 1);
        }
        if (bVar10) goto LAB_0011fdaf;
        byte = '\x01';
        PacketBuilder::AddByte((PacketBuilder *)local_1f0,0xff);
      }
      else {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
          operator_delete(local_1c0.first._M_dataplus._M_p,
                          local_1c0.first.field_2._M_allocated_capacity + 1);
        }
LAB_0011fdaf:
        pMVar16 = World::GetMap(pWVar3,pCVar7->mapid);
        PacketBuilder::AddByte((PacketBuilder *)local_1f0,pMVar16->rid[0]);
        pMVar16 = World::GetMap(pWVar3,pCVar7->mapid);
        byte = pMVar16->rid[1];
      }
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,byte);
      pMVar16 = World::GetMap(pWVar3,pCVar7->mapid);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,pMVar16->rid[2]);
      pMVar16 = World::GetMap(pWVar3,pCVar7->mapid);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,pMVar16->rid[3]);
      pMVar16 = World::GetMap(pWVar3,pCVar7->mapid);
      PacketBuilder::AddThree((PacketBuilder *)local_1f0,pMVar16->filesize);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->eif->rid)._M_elems[0]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->eif->rid)._M_elems[1]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->eif->rid)._M_elems[2]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->eif->rid)._M_elems[3]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->eif->len)._M_elems[0]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->eif->len)._M_elems[1]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->enf->rid)._M_elems[0]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->enf->rid)._M_elems[1]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->enf->rid)._M_elems[2]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->enf->rid)._M_elems[3]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->enf->len)._M_elems[0]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->enf->len)._M_elems[1]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->esf->rid)._M_elems[0]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->esf->rid)._M_elems[1]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->esf->rid)._M_elems[2]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->esf->rid)._M_elems[3]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->esf->len)._M_elems[0]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->esf->len)._M_elems[1]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->ecf->rid)._M_elems[0]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->ecf->rid)._M_elems[1]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->ecf->rid)._M_elems[2]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->ecf->rid)._M_elems[3]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->ecf->len)._M_elems[0]);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,(pWVar3->ecf->len)._M_elems[1]);
      (*(pCVar7->super_Command_Source)._vptr_Command_Source[2])(&local_1c0,pCVar7);
      PacketBuilder::AddBreakString((PacketBuilder *)local_1f0,&local_1c0.first,0xff);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
        operator_delete(local_1c0.first._M_dataplus._M_p,
                        local_1c0.first.field_2._M_allocated_capacity + 1);
      }
      PacketBuilder::AddBreakString((PacketBuilder *)local_1f0,&pCVar7->title,0xff);
      PacketBuilder::AddBreakString((PacketBuilder *)local_1f0,&local_b0,0xff);
      PacketBuilder::AddBreakString((PacketBuilder *)local_1f0,&local_d0,0xff);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)pCVar7->clas);
      Character::PaddedGuildTag_abi_cxx11_(&local_1c0.first,pCVar7);
      PacketBuilder::AddString((PacketBuilder *)local_1f0,&local_1c0.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
        operator_delete(local_1c0.first._M_dataplus._M_p,
                        local_1c0.first.field_2._M_allocated_capacity + 1);
      }
      p_Var19 = (pWVar3->admin_config).
                super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ._M_h._M_before_begin._M_nxt;
      if (p_Var19 == (_Hash_node_base *)0x0) {
        local_148 = (string *)CONCAT71(local_148._1_7_,4);
      }
      else {
        local_148 = (string *)CONCAT71(local_148._1_7_,4);
        do {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
          ::pair(&local_1c0,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                  *)(p_Var19 + 1));
          iVar11 = std::__cxx11::string::compare((char *)&local_1c0);
          if ((iVar11 != 0) &&
             (iVar11 = std::__cxx11::string::compare((char *)&local_1c0), iVar11 != 0)) {
            util::variant::GetString_abi_cxx11_(&local_138,&local_1c0.second);
            iVar11 = util::to_int(&local_138);
            bVar2 = (byte)iVar11;
            if ((byte)local_148 < (byte)iVar11) {
              bVar2 = (byte)local_148;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            local_148 = (string *)CONCAT71(local_148._1_7_,bVar2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0.second.val_string._M_dataplus._M_p !=
              &local_1c0.second.val_string.field_2) {
            operator_delete(local_1c0.second.val_string._M_dataplus._M_p,
                            local_1c0.second.val_string.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
            operator_delete(local_1c0.first._M_dataplus._M_p,
                            local_1c0.first.field_2._M_allocated_capacity + 1);
          }
          p_Var19 = p_Var19->_M_nxt;
        } while (p_Var19 != (_Hash_node_base *)0x0);
      }
      pCVar7 = local_160;
      uVar12 = (**(local_160->super_Command_Source)._vptr_Command_Source)(local_160);
      pPVar9 = local_150;
      local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"seehide","");
      this_00 = &local_140->admin_config;
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,&local_1c0.first);
      iVar11 = util::variant::GetInt(pmVar15);
      if ((int)(uVar12 & 0xff) < iVar11) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
          operator_delete(local_1c0.first._M_dataplus._M_p,
                          local_1c0.first.field_2._M_allocated_capacity + 1);
        }
LAB_001202bb:
        uVar12 = (*(pCVar7->super_Command_Source)._vptr_Command_Source[1])(pCVar7);
        local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"nowall","");
        pmVar15 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,&local_1c0.first);
        iVar11 = util::variant::GetInt(pmVar15);
        if ((int)(uVar12 & 0xff) < iVar11) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
            operator_delete(local_1c0.first._M_dataplus._M_p,
                            local_1c0.first.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          iVar11 = (*(pCVar7->super_Command_Source)._vptr_Command_Source[1])(pCVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
            operator_delete(local_1c0.first._M_dataplus._M_p,
                            local_1c0.first.field_2._M_allocated_capacity + 1);
          }
          uVar12 = 3;
          if ((byte)iVar11 < 3) goto LAB_0012037f;
        }
        iVar11 = (**(pCVar7->super_Command_Source)._vptr_Command_Source)(pCVar7);
        if (((byte)iVar11 < (byte)local_148) ||
           (iVar11 = (**(pCVar7->super_Command_Source)._vptr_Command_Source)(pCVar7),
           (char)iVar11 != '\0')) {
          uVar12 = (**(pCVar7->super_Command_Source)._vptr_Command_Source)(pCVar7);
          uVar12 = uVar12 & 0xff;
        }
        else {
          uVar12 = 1;
        }
      }
      else {
        iVar11 = (**(pCVar7->super_Command_Source)._vptr_Command_Source)(pCVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
          operator_delete(local_1c0.first._M_dataplus._M_p,
                          local_1c0.first.field_2._M_allocated_capacity + 1);
        }
        uVar12 = 4;
        if (3 < (byte)iVar11) goto LAB_001202bb;
      }
LAB_0012037f:
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,uVar12);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,(uint)pCVar7->level);
      PacketBuilder::AddInt((PacketBuilder *)local_1f0,pCVar7->exp);
      PacketBuilder::AddInt((PacketBuilder *)local_1f0,pCVar7->usage);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->hp);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->maxhp);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->tp);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->maxtp);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->maxsp);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->statpoints);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->skillpoints);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->karma);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->mindam);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->maxdam);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->accuracy);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->evade);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,pCVar7->armor);
      local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"OldVersionCompat","");
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_158,&local_1c0.first);
      bVar10 = util::variant::GetBool(pmVar15);
      if (bVar10) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
          operator_delete(local_1c0.first._M_dataplus._M_p,
                          local_1c0.first.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar11 = pPVar9->client->version;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
          operator_delete(local_1c0.first._M_dataplus._M_p,
                          local_1c0.first.field_2._M_allocated_capacity + 1);
        }
        if (iVar11 < 0x1c) {
          PacketBuilder::AddChar((PacketBuilder *)local_1f0,*pCVar7->display_str);
          PacketBuilder::AddChar((PacketBuilder *)local_1f0,*pCVar7->display_wis);
          PacketBuilder::AddChar((PacketBuilder *)local_1f0,*pCVar7->display_intl);
          PacketBuilder::AddChar((PacketBuilder *)local_1f0,*pCVar7->display_agi);
          PacketBuilder::AddChar((PacketBuilder *)local_1f0,*pCVar7->display_con);
          PacketBuilder::AddChar((PacketBuilder *)local_1f0,*pCVar7->display_cha);
          goto LAB_0012060e;
        }
      }
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,*pCVar7->display_str);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,*pCVar7->display_wis);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,*pCVar7->display_intl);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,*pCVar7->display_agi);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,*pCVar7->display_con);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,*pCVar7->display_cha);
LAB_0012060e:
      lVar20 = 0x2e8;
      do {
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_1f0,
                   *(int *)((long)&(pCVar7->super_Command_Source)._vptr_Command_Source + lVar20));
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0x324);
      local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"GuildEditRank","");
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_158,&local_1c0.first);
      iVar13 = util::variant::GetInt(pmVar15);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"GuildKickRank","");
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_158,&local_138);
      iVar11 = util::variant::GetInt(pmVar15);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"GuildPromoteRank","");
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_158,&local_f0);
      iVar14 = util::variant::GetInt(pmVar15);
      if (iVar11 < iVar13) {
        iVar11 = iVar13;
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"GuildDemoteRank","");
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_158,&local_110);
      iVar13 = util::variant::GetInt(pmVar15);
      if (iVar14 < iVar11) {
        iVar14 = iVar11;
      }
      if (iVar14 <= iVar13) {
        iVar14 = iVar13;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      pCVar7 = local_160;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
        operator_delete(local_1c0.first._M_dataplus._M_p,
                        local_1c0.first.field_2._M_allocated_capacity + 1);
      }
      pPVar9 = local_150;
      uVar12 = (uint)pCVar7->guild_rank;
      if (((int)(uint)pCVar7->guild_rank <= iVar14) &&
         ((pCVar7->guild).super___shared_ptr<Guild,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0)) {
        uVar12 = 1;
      }
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,uVar12);
      local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"JailMap","");
      pmVar15 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[](local_158,&local_1c0.first);
      iVar11 = util::variant::GetInt(pmVar15);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,iVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
        operator_delete(local_1c0.first._M_dataplus._M_p,
                        local_1c0.first.field_2._M_allocated_capacity + 1);
      }
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,4);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,0x18);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,0x18);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,0);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,0);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,0);
      PacketBuilder::AddShort((PacketBuilder *)local_1f0,2);
      PacketBuilder::AddChar((PacketBuilder *)local_1f0,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1f0,0xff);
      Player::Send(pPVar9,(PacketBuilder *)local_1f0);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      (*(pCVar7->super_Command_Source)._vptr_Command_Source[2])(local_1f0,pCVar7);
      PacketBuilder::PacketBuilder
                ((PacketBuilder *)&local_1c0,PACKET_WELCOME,PACKET_REPLY,
                 (size_t)(local_1f0._8_8_ +
                         (pCVar7->spells).
                         super__List_base<Character_Spell,_std::allocator<Character_Spell>_>._M_impl
                         ._M_node._M_size * 4 +
                         (pCVar7->inventory).
                         super__List_base<Character_Item,_std::allocator<Character_Item>_>._M_impl.
                         _M_node._M_size * 6 + 0x41));
      pcVar1 = local_1f0 + 0x10;
      if ((pointer)local_1f0._0_8_ != pcVar1) {
        operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      }
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,2);
      PacketBuilder::AddByte((PacketBuilder *)&local_1c0,0xff);
      iVar11 = 9;
      do {
        PacketBuilder::AddByte((PacketBuilder *)&local_1c0,0xff);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,pCVar7->weight);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,pCVar7->maxweight);
      p_Var18 = (_List_node_base *)&pCVar7->inventory;
      while (p_Var18 = (((_List_base<Character_Item,_std::allocator<Character_Item>_> *)
                        &p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var18 != (_List_node_base *)&pCVar7->inventory) {
        iVar11 = *(int *)((long)&p_Var18[1]._M_next + 4);
        PacketBuilder::AddShort((PacketBuilder *)&local_1c0,(int)*(short *)&p_Var18[1]._M_next);
        PacketBuilder::AddInt((PacketBuilder *)&local_1c0,iVar11);
      }
      PacketBuilder::AddByte((PacketBuilder *)&local_1c0,0xff);
      this = local_160;
      p_Var18 = (_List_node_base *)&pCVar7->spells;
      while (p_Var18 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)
                        &p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var18 != (_List_node_base *)&pCVar7->spells) {
        bVar2 = *(undefined1 *)((long)&p_Var18[1]._M_next + 2);
        PacketBuilder::AddShort((PacketBuilder *)&local_1c0,(int)*(short *)&p_Var18[1]._M_next);
        PacketBuilder::AddShort((PacketBuilder *)&local_1c0,(uint)bVar2);
      }
      PacketBuilder::AddByte((PacketBuilder *)&local_1c0,0xff);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,1);
      PacketBuilder::AddByte((PacketBuilder *)&local_1c0,0xff);
      (*(this->super_Command_Source)._vptr_Command_Source[2])(local_1f0,this);
      PacketBuilder::AddBreakString((PacketBuilder *)&local_1c0,(string *)local_1f0,0xff);
      if ((pointer)local_1f0._0_8_ != pcVar1) {
        operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      }
      iVar11 = Character::PlayerID(this);
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,iVar11);
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,(int)this->mapid);
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,(uint)this->x);
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,(uint)this->y);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,(uint)this->direction);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,6);
      Character::PaddedGuildTag_abi_cxx11_((string *)local_1f0,this);
      PacketBuilder::AddString((PacketBuilder *)&local_1c0,(string *)local_1f0);
      if ((pointer)local_1f0._0_8_ != pcVar1) {
        operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
      }
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,(uint)this->level);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,(uint)this->gender);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,(uint)this->hairstyle);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,(uint)this->haircolor);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,(uint)this->race);
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,this->maxhp);
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,this->hp);
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,this->maxtp);
      PacketBuilder::AddShort((PacketBuilder *)&local_1c0,this->tp);
      Character::AddPaperdollData(this,(PacketBuilder *)&local_1c0,"B000A0HSW");
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,(uint)this->sitting);
      PacketBuilder::AddChar((PacketBuilder *)&local_1c0,this->hidden & 1);
      PacketBuilder::AddByte((PacketBuilder *)&local_1c0,0xff);
      PacketBuilder::AddByte((PacketBuilder *)&local_1c0,0xff);
      Player::Send(local_150,(PacketBuilder *)&local_1c0);
      PacketBuilder::~PacketBuilder((PacketBuilder *)&local_1c0);
      Character::Warp(this,this->mapid,this->x,this->y,WARP_ANIMATION_NONE);
      return;
    }
    iVar11 = (*(from->super_Command_Source)._vptr_Command_Source[4])(from);
    local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"character_not_found","");
    I18N::Format<>(&local_90,(I18N *)(CONCAT44(extraout_var_00,iVar11) + 0x490),&local_1c0.first);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_90);
    local_70.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) goto LAB_0011fb13;
  }
  else {
    iVar11 = (*(from->super_Command_Source)._vptr_Command_Source[4])(from);
    local_1c0.first._M_dataplus._M_p = (pointer)&local_1c0.first.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"unknown_command","");
    I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var,iVar11) + 0x490),&local_1c0.first);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0011fb13;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_0011fb13:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.first._M_dataplus._M_p != &local_1c0.first.field_2) {
    operator_delete(local_1c0.first._M_dataplus._M_p,
                    local_1c0.first.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Duty(const std::vector<std::string>& arguments, Character* from)
{
	World* world = from->world;

	if (!world->config["UseDutyAdmin"])
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
		return;
	}

	Player* player = from->player;
	Character* swap = nullptr;

	bool dutyoff = !player->dutylast.empty();

	for (Character* c : from->player->characters)
	{
		if ((dutyoff && c->real_name == player->dutylast)
		 || (!dutyoff && c != from && c->admin))
		{
			if (player->dutylast.empty())
				player->dutylast = from->real_name;
			else
				player->dutylast.clear();

			swap = c;
			break;
		}
	}

	if (!swap)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
		return;
	}

	from->Logout();
	player->character = swap;

	if (!dutyoff && arguments.size() > 0 && util::lowercase(arguments[0]) == "here")
	{
		swap->mapid = from->mapid;
		swap->x = from->x;
		swap->y = from->y;
		swap->direction = from->direction;
		swap->sitting = from->sitting;
	}

	swap->faux_name = from->SourceName();

	world->Login(swap);
	swap->CalculateStats();

	{
		std::string guild_str = swap->GuildNameString();
		std::string guild_rank = swap->GuildRankString();

		PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY,
			114 + swap->paperdoll.size() * 2 + swap->SourceName().length() + swap->title.length()
			+ guild_str.length() + guild_rank.length());

		reply.AddShort(1); // REPLY_WELCOME sub-id
		reply.AddShort(swap->PlayerID());
		reply.AddInt(swap->id);
		reply.AddShort(swap->mapid); // Map ID

		if (world->config["GlobalPK"] && !world->PKExcept(swap->mapid))
		{
			reply.AddByte(0xFF);
			reply.AddByte(0x01);
		}
		else
		{
			reply.AddByte(world->GetMap(swap->mapid)->rid[0]);
			reply.AddByte(world->GetMap(swap->mapid)->rid[1]);
		}

		reply.AddByte(world->GetMap(swap->mapid)->rid[2]);
		reply.AddByte(world->GetMap(swap->mapid)->rid[3]);
		reply.AddThree(world->GetMap(swap->mapid)->filesize);
		reply.AddByte(world->eif->rid[0]);
		reply.AddByte(world->eif->rid[1]);
		reply.AddByte(world->eif->rid[2]);
		reply.AddByte(world->eif->rid[3]);
		reply.AddByte(world->eif->len[0]);
		reply.AddByte(world->eif->len[1]);
		reply.AddByte(world->enf->rid[0]);
		reply.AddByte(world->enf->rid[1]);
		reply.AddByte(world->enf->rid[2]);
		reply.AddByte(world->enf->rid[3]);
		reply.AddByte(world->enf->len[0]);
		reply.AddByte(world->enf->len[1]);
		reply.AddByte(world->esf->rid[0]);
		reply.AddByte(world->esf->rid[1]);
		reply.AddByte(world->esf->rid[2]);
		reply.AddByte(world->esf->rid[3]);
		reply.AddByte(world->esf->len[0]);
		reply.AddByte(world->esf->len[1]);
		reply.AddByte(world->ecf->rid[0]);
		reply.AddByte(world->ecf->rid[1]);
		reply.AddByte(world->ecf->rid[2]);
		reply.AddByte(world->ecf->rid[3]);
		reply.AddByte(world->ecf->len[0]);
		reply.AddByte(world->ecf->len[1]);
		reply.AddBreakString(swap->SourceName());
		reply.AddBreakString(swap->title);
		reply.AddBreakString(guild_str); // Guild Name
		reply.AddBreakString(guild_rank); // Guild Rank
		reply.AddChar(swap->clas);
		reply.AddString(swap->PaddedGuildTag());

		// Tell a player's client they're a higher level admin than they are to enable some features

		AdminLevel lowest_command = ADMIN_HGM;

		UTIL_FOREACH(world->admin_config, ac)
		{
			if (ac.first == "killnpc" || ac.first == "reports")
			{
				continue;
			}

			lowest_command = std::min<AdminLevel>(lowest_command, static_cast<AdminLevel>(util::to_int(ac.second)));
		}

		if (swap->SourceAccess() >= static_cast<int>(world->admin_config["seehide"])
		 && swap->SourceAccess() < ADMIN_HGM)
		{
			reply.AddChar(ADMIN_HGM);
		}
		else if (swap->SourceDutyAccess() >= static_cast<int>(world->admin_config["nowall"])
		 && swap->SourceDutyAccess() < ADMIN_GM)
		{
			reply.AddChar(ADMIN_GM);
		}
		else if (swap->SourceAccess() >= lowest_command
		 && swap->SourceAccess() < ADMIN_GUIDE)
		{
			reply.AddChar(ADMIN_GUIDE);
		}
		else
		{
			reply.AddChar(swap->SourceAccess());
		}

		reply.AddChar(swap->level);
		reply.AddInt(swap->exp);
		reply.AddInt(swap->usage);
		reply.AddShort(swap->hp);
		reply.AddShort(swap->maxhp);
		reply.AddShort(swap->tp);
		reply.AddShort(swap->maxtp);
		reply.AddShort(swap->maxsp);
		reply.AddShort(swap->statpoints);
		reply.AddShort(swap->skillpoints);
		reply.AddShort(swap->karma);
		reply.AddShort(swap->mindam);
		reply.AddShort(swap->maxdam);
		reply.AddShort(swap->accuracy);
		reply.AddShort(swap->evade);
		reply.AddShort(swap->armor);

		if (!world->config["OldVersionCompat"] && player->client->version < 28)
		{
			reply.AddChar(swap->display_str);
			reply.AddChar(swap->display_wis);
			reply.AddChar(swap->display_intl);
			reply.AddChar(swap->display_agi);
			reply.AddChar(swap->display_con);
			reply.AddChar(swap->display_cha);
		}
		else
		{
			reply.AddShort(swap->display_str);
			reply.AddShort(swap->display_wis);
			reply.AddShort(swap->display_intl);
			reply.AddShort(swap->display_agi);
			reply.AddShort(swap->display_con);
			reply.AddShort(swap->display_cha);
		}

		UTIL_FOREACH(swap->paperdoll, item)
		{
			reply.AddShort(item);
		}

		int leader_rank = std::max(std::max(std::max(static_cast<int>(world->config["GuildEditRank"]), static_cast<int>(world->config["GuildKickRank"])),
								   static_cast<int>(world->config["GuildPromoteRank"])), static_cast<int>(world->config["GuildDemoteRank"]));

		if (swap->guild_rank <= leader_rank && swap->guild)
		{
			reply.AddChar(1); // Allows client access to the guild management tools
		}
		else
		{
			reply.AddChar(swap->guild_rank);
		}

		reply.AddShort(static_cast<int>(world->config["JailMap"]));
		reply.AddShort(4); // ?
		reply.AddChar(24); // ?
		reply.AddChar(24); // ?
		reply.AddShort(0); // Light guide admin command flood rate
		reply.AddShort(0); // Guardian admin command flood rate
		reply.AddShort(0); // GM/HGM admin command flood rate
		reply.AddShort(2); // ?
		reply.AddChar(0); // Login warning message
		reply.AddByte(255);

		player->Send(reply);
	}

	{
		PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY, 65 + swap->SourceName().length() + swap->inventory.size() * 6 + swap->spells.size() * 4);

		reply.AddShort(2); // REPLY_WELCOME sub-id
		// MotDs
		reply.AddByte(255);

		for (int i = 0; i < 9; ++i)
		{
			reply.AddByte(255);
		}

		// ??
		reply.AddChar(swap->weight); // Weight
		reply.AddChar(swap->maxweight); // Max Weight
		UTIL_FOREACH(swap->inventory, item)
		{
			reply.AddShort(item.id);
			reply.AddInt(item.amount);
		}
		reply.AddByte(255);
		UTIL_FOREACH(swap->spells, spell)
		{
			reply.AddShort(spell.id); // Spell ID
			reply.AddShort(spell.level); // Spell Level
		}
		reply.AddByte(255);

		reply.AddChar(1); // Number of players
		reply.AddByte(255);

		reply.AddBreakString(swap->SourceName());
		reply.AddShort(swap->PlayerID());
		reply.AddShort(swap->mapid);
		reply.AddShort(swap->x);
		reply.AddShort(swap->y);
		reply.AddChar(swap->direction);
		reply.AddChar(6); // ?
		reply.AddString(swap->PaddedGuildTag());
		reply.AddChar(swap->level);
		reply.AddChar(swap->gender);
		reply.AddChar(swap->hairstyle);
		reply.AddChar(swap->haircolor);
		reply.AddChar(swap->race);
		reply.AddShort(swap->maxhp);
		reply.AddShort(swap->hp);
		reply.AddShort(swap->maxtp);
		reply.AddShort(swap->tp);
		swap->AddPaperdollData(reply, "B000A0HSW");
		reply.AddChar(swap->sitting);
		reply.AddChar(swap->IsHideInvisible());
		reply.AddByte(255);

		reply.AddByte(255);

		player->Send(reply);
	}

	swap->Warp(swap->mapid, swap->x, swap->y, WARP_ANIMATION_NONE);
}